

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O0

bool anon_unknown.dwarf_12932::SolverDpllTriadSimd<0>::InitPencilmarkByBox(char *input,State *state)

{
  bool bVar1;
  uint32_t uVar2;
  void *in_RDI;
  longlong in_YMM0_H;
  longlong lVar3;
  uint32_t cell_eliminations;
  int cell;
  int elm_j;
  int elm_i;
  Cells16 box_candidates;
  int box_j;
  int box_i;
  char buf [736];
  int local_368;
  int local_364;
  longlong in_stack_fffffffffffffcb0;
  int local_338;
  int local_334;
  char local_330 [248];
  Cells16 *in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdd4;
  State *in_stack_fffffffffffffdd8;
  
  memcpy(local_330,in_RDI,0x2d9);
  local_334 = 0;
  do {
    if (2 < local_334) {
      return true;
    }
    lVar3 = in_YMM0_H;
    for (local_338 = 0; in_YMM0_H = lVar3, local_338 < 3; local_338 = local_338 + 1) {
      Bitvec16x16::All((uint16_t)((ulong)in_stack_fffffffffffffcb0 >> 0x30));
      for (local_364 = 0; local_364 < 3; local_364 = local_364 + 1) {
        for (local_368 = 0; local_368 < 3; local_368 = local_368 + 1) {
          uVar2 = WhichDots16(local_330 +
                              (local_334 * 0x1b + local_364 * 9 + local_338 * 3 + local_368) * 9);
          Bitvec16x16::Insert((Bitvec16x16 *)&stack0xfffffffffffffca0,local_364 * 4 + local_368,
                              ((ushort)uVar2 ^ 0xffff) & 0x1ff);
        }
      }
      lVar3 = 0;
      bVar1 = BoxRestrict<0>(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
                             in_stack_fffffffffffffdc8);
      if (!bVar1) {
        return false;
      }
      in_stack_fffffffffffffcb0 = in_YMM0_H;
    }
    local_334 = local_334 + 1;
  } while( true );
}

Assistant:

static bool InitPencilmarkByBox(const char *input, State &state) {
        char buf[736]; // make sure unaligned 16 byte cell reads won't go past end of buffer
        memcpy(&buf, input, 729);
        for (int box_i = 0; box_i < 3; box_i++) {
            for (int box_j = 0; box_j < 3; box_j++) {
                Cells16 box_candidates = Cells16::All(kAll);
                for (int elm_i = 0; elm_i < 3; elm_i++) {
                    for (int elm_j = 0; elm_j < 3; elm_j++) {
                        int cell = box_i * 27 + elm_i * 9 + box_j * 3 + elm_j;
                        auto cell_eliminations = WhichDots16(&buf[cell * 9]);
                        box_candidates.Insert(elm_i * 4 + elm_j, kAll & ~cell_eliminations);
                    }
                }
                if (!BoxRestrict<0>(state, box_i * 3 + box_j, box_candidates)) return false;
            }
        }
        return true;
    }